

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O0

void mainLoopStep(void)

{
  int iVar1;
  Console *this;
  Controller *this_00;
  Console *c;
  SDL_Event event;
  Uint32 local_38 [3];
  char local_2b;
  int local_24;
  
  this = Console::Instance();
  iVar1 = SDL_PollEvent(local_38);
  if (iVar1 != 0) {
    if (local_38[0] == vsyncEvent) {
      SDL_UpdateTexture(texture,0,surface->pixels,surface->pitch);
      SDL_RenderClear(renderer);
      SDL_RenderCopy(renderer,texture,0);
      SDL_RenderPresent(renderer);
    }
    if (local_38[0] == 0x100) {
      isRunning = false;
    }
    if ((local_38[0] == 0x300) && (local_2b == '\0')) {
      if (((mainLoopStep::states[0] & 1U) == 0) && (local_24 == 0x7a)) {
        mainLoopStep::states[0] = true;
      }
      if (((mainLoopStep::states[1] & 1U) == 0) && (local_24 == 0x78)) {
        mainLoopStep::states[1] = true;
      }
      if (((mainLoopStep::states[2] & 1U) == 0) && (local_24 == 0x20)) {
        mainLoopStep::states[2] = true;
      }
      if (((mainLoopStep::states[3] & 1U) == 0) && (local_24 == 0xd)) {
        mainLoopStep::states[3] = true;
      }
      if (((mainLoopStep::states[4] & 1U) == 0) && (local_24 == 0x40000052)) {
        mainLoopStep::states[4] = true;
      }
      if (((mainLoopStep::states[5] & 1U) == 0) && (local_24 == 0x40000051)) {
        mainLoopStep::states[5] = true;
      }
      if (((mainLoopStep::states[6] & 1U) == 0) && (local_24 == 0x40000050)) {
        mainLoopStep::states[6] = true;
      }
      if (((mainLoopStep::states[7] & 1U) == 0) && (local_24 == 0x4000004f)) {
        mainLoopStep::states[7] = true;
      }
    }
    if (local_38[0] == 0x301) {
      if (((mainLoopStep::states[0] & 1U) != 0) && (local_24 == 0x7a)) {
        mainLoopStep::states[0] = false;
      }
      if (((mainLoopStep::states[1] & 1U) != 0) && (local_24 == 0x78)) {
        mainLoopStep::states[1] = false;
      }
      if (((mainLoopStep::states[2] & 1U) != 0) && (local_24 == 0x20)) {
        mainLoopStep::states[2] = false;
      }
      if (((mainLoopStep::states[3] & 1U) != 0) && (local_24 == 0xd)) {
        mainLoopStep::states[3] = false;
      }
      if (((mainLoopStep::states[4] & 1U) != 0) && (local_24 == 0x40000052)) {
        mainLoopStep::states[4] = false;
      }
      if (((mainLoopStep::states[5] & 1U) != 0) && (local_24 == 0x40000051)) {
        mainLoopStep::states[5] = false;
      }
      if (((mainLoopStep::states[6] & 1U) != 0) && (local_24 == 0x40000050)) {
        mainLoopStep::states[6] = false;
      }
      if (((mainLoopStep::states[7] & 1U) != 0) && (local_24 == 0x4000004f)) {
        mainLoopStep::states[7] = false;
      }
    }
    this_00 = Console::getController(this);
    Controller::setButtons(this_00,mainLoopStep::states);
  }
  return;
}

Assistant:

void mainLoopStep() {
    SDL_Event event;
    static bool states[8] = {false, false, false, false, false, false, false, false};
    Console &c = Console::Instance();
    if (SDL_PollEvent(&event)) {
        if (event.type == vsyncEvent) {
            SDL_UpdateTexture(texture, NULL, surface->pixels, surface->pitch);
            SDL_RenderClear(renderer);
            SDL_RenderCopy(renderer, texture, NULL, NULL);
            SDL_RenderPresent(renderer);
        }
#ifndef __EMSCRIPTEN__
        if (event.type == SDL_QUIT) {
            isRunning = false;
        }
        if (event.type == SDL_KEYDOWN) {
            if (event.key.repeat == 0) {
                if (!states[Buttons::A] && event.key.keysym.sym == SDLK_z) {
                    states[Buttons::A] = true;
                }
                if (!states[Buttons::B] && event.key.keysym.sym == SDLK_x) {
                    states[Buttons::B] = true;
                }
                if (!states[Buttons::SELECT] && event.key.keysym.sym == SDLK_SPACE) {
                    states[Buttons::SELECT] = true;
                }
                if (!states[Buttons::START] && event.key.keysym.sym == SDLK_RETURN) {
                    states[Buttons::START] = true;
                }
                if (!states[Buttons::UP] && event.key.keysym.sym == SDLK_UP) {
                    states[Buttons::UP] = true;
                }
                if (!states[Buttons::DOWN] && event.key.keysym.sym == SDLK_DOWN) {
                    states[Buttons::DOWN] = true;
                }
                if (!states[Buttons::LEFT] && event.key.keysym.sym == SDLK_LEFT) {
                    states[Buttons::LEFT] = true;
                }
                if (!states[Buttons::RIGHT] && event.key.keysym.sym == SDLK_RIGHT) {
                    states[Buttons::RIGHT] = true;
                }

            }
        }
        if (event.type == SDL_KEYUP) {
            if (states[Buttons::A] && event.key.keysym.sym == SDLK_z) {
                states[Buttons::A] = false;
            }
            if (states[Buttons::B] && event.key.keysym.sym == SDLK_x) {
                states[Buttons::B] = false;
            }
            if (states[Buttons::SELECT] && event.key.keysym.sym == SDLK_SPACE) {
                states[Buttons::SELECT] = false;
            }
            if (states[Buttons::START] && event.key.keysym.sym == SDLK_RETURN) {
                states[Buttons::START] = false;
            }
            if (states[Buttons::UP] && event.key.keysym.sym == SDLK_UP) {
                states[Buttons::UP] = false;
            }
            if (states[Buttons::DOWN] && event.key.keysym.sym == SDLK_DOWN) {
                states[Buttons::DOWN] = false;
            }
            if (states[Buttons::LEFT] && event.key.keysym.sym == SDLK_LEFT) {
                states[Buttons::LEFT] = false;
            }
            if (states[Buttons::RIGHT] && event.key.keysym.sym == SDLK_RIGHT) {
                states[Buttons::RIGHT] = false;
            }
        }
        c.getController()->setButtons(states);
#endif
    }
}